

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status
fdb_get_all_snap_markers
          (fdb_file_handle *fhandle,fdb_snapshot_info_t **markers_out,uint64_t *num_markers)

{
  fdb_kvs_handle *handle;
  bool bVar1;
  fdb_status fVar2;
  filemgr_header_revnum_t fVar3;
  fdb_snapshot_info_t *snap_info;
  __int_type _Var4;
  filemgr_header_revnum_t fVar5;
  int64_t iVar6;
  fdb_kvs_commit_marker_t *pfVar7;
  long lVar8;
  uint64_t size;
  fdb_status local_1120;
  file_status_t fstatus;
  fdb_snapshot_info_t *local_1118;
  fdb_seqnum_t seqnum;
  uint64_t version;
  size_t header_len;
  err_log_callback *local_10f8;
  filemgr_header_revnum_t revnum;
  fdb_snapshot_info_t **local_10e8;
  uint64_t *local_10e0;
  ulong local_10d8;
  ulong local_10d0;
  uint64_t kv_info_offset;
  bid_t stale_root_bid;
  bid_t seq_root_bid;
  bid_t trie_root_bid;
  docio_object local_10a8;
  char *compacted_filename;
  uint64_t header_flags;
  uint64_t last_wal_flush_hdr_bid;
  uint64_t datasize;
  uint64_t nlivenodes;
  uint64_t ndeletes;
  uint64_t ndocs;
  uint8_t header_buf [4096];
  
  trie_root_bid = 0xffffffffffffffff;
  seq_root_bid = 0xffffffffffffffff;
  stale_root_bid = 0xffffffffffffffff;
  if (fhandle == (fdb_file_handle *)0x0) {
    local_1120 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    local_1120 = FDB_RESULT_INVALID_ARGS;
    if (num_markers != (uint64_t *)0x0 && markers_out != (fdb_snapshot_info_t **)0x0) {
      handle = fhandle->root;
      if (handle->file == (filemgr *)0x0) {
        local_1120 = FDB_RESULT_FILE_NOT_OPEN;
      }
      else {
        fdb_check_file_reopen(handle,&fstatus);
        fdb_sync_db_header(handle);
        _Var4 = (handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i;
        fVar3 = sb_get_min_live_revnum(handle->file);
        local_1120 = FDB_RESULT_NO_DB_INSTANCE;
        local_10d8 = _Var4 - fVar3;
        if (local_10d8 != 0) {
          snap_info = (fdb_snapshot_info_t *)calloc(local_10d8,0x18);
          local_1120 = FDB_RESULT_ALLOC_FAIL;
          if (snap_info != (fdb_snapshot_info_t *)0x0) {
            seqnum = handle->seqnum;
            _Var4 = (handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
            header_len = (size_t)(handle->file->header).size;
            local_10d0 = (handle->file->config->num_keeping_headers).
                         super___atomic_base<unsigned_long>._M_i;
            local_1118 = snap_info;
            local_10e8 = markers_out;
            local_10e0 = num_markers;
            if (header_len == 0) {
              size = 0;
              local_1120 = FDB_RESULT_SUCCESS;
            }
            else {
              local_10f8 = &handle->log_callback;
              local_1120 = FDB_RESULT_SUCCESS;
              size = 0;
              while (((handle->config).block_reusing_threshold - 100 < 0xffffffffffffff9d ||
                     (size < local_10d0))) {
                if (size == 0) {
                  local_1120 = filemgr_fetch_header
                                         (handle->file,
                                          (handle->last_hdr_bid).super___atomic_base<unsigned_long>.
                                          _M_i,header_buf,&header_len,&seqnum,&revnum,
                                          (uint64_t *)0x0,&version,(uint64_t *)0x0,local_10f8);
                }
                else {
                  if (local_10d8 <= size) break;
                  _Var4 = filemgr_fetch_prev_header
                                    (handle->file,_Var4,header_buf,&header_len,&seqnum,&revnum,
                                     (uint64_t *)0x0,&version,(uint64_t *)0x0,local_10f8);
                }
                if ((header_len == 0) ||
                   ((bVar1 = ver_superblock_support(version), fVar3 = revnum, bVar1 &&
                    (fVar5 = sb_get_min_live_revnum(handle->file), fVar3 < fVar5)))) break;
                fdb_fetch_header(version,header_buf,&trie_root_bid,&seq_root_bid,&stale_root_bid,
                                 &ndocs,&ndeletes,&nlivenodes,&datasize,&last_wal_flush_hdr_bid,
                                 &kv_info_offset,&header_flags,&compacted_filename,(char **)0x0);
                snap_info->marker = _Var4;
                if (kv_info_offset == 0xffffffffffffffff) {
                  snap_info->num_kvs_markers = 1;
                  pfVar7 = (fdb_kvs_commit_marker_t *)malloc(0x10);
                  snap_info->kvs_markers = pfVar7;
                  if (pfVar7 == (fdb_kvs_commit_marker_t *)0x0) {
                    fdb_free_snap_markers(local_1118,size);
                    return FDB_RESULT_ALLOC_FAIL;
                  }
                  pfVar7->seqnum = seqnum;
                  pfVar7->kv_store_name = (char *)0x0;
                }
                else {
                  local_10a8.field_3.seqnum = 0;
                  local_10a8.meta = (void *)0x0;
                  local_10a8.timestamp = 0;
                  local_10a8._20_4_ = 0;
                  local_10a8.key = (void *)0x0;
                  local_10a8.length.keylen = 0;
                  local_10a8.length.metalen = 0;
                  local_10a8.length.bodylen = 0;
                  local_10a8.length.bodylen_ondisk = 0;
                  local_10a8.length.flag = '\0';
                  local_10a8.length.checksum = '\0';
                  local_10a8.length.reserved = 0;
                  local_10a8.body = (void *)0x0;
                  iVar6 = docio_read_doc(handle->dhandle,kv_info_offset,&local_10a8,true);
                  if (iVar6 < 1) {
                    fdb_free_snap_markers(local_1118,size);
                    if (iVar6 == 0) {
                      return FDB_RESULT_READ_FAIL;
                    }
                    return (fdb_status)iVar6;
                  }
                  fVar2 = _fdb_kvs_get_snap_info(local_10a8.body,version,snap_info);
                  if (fVar2 != FDB_RESULT_SUCCESS) {
                    fdb_free_snap_markers(local_1118,size);
                    return fVar2;
                  }
                  pfVar7 = snap_info->kvs_markers;
                  lVar8 = (snap_info->num_kvs_markers << 0x20) + -0x100000000 >> 0x1c;
                  *(fdb_seqnum_t *)((long)&pfVar7->seqnum + lVar8) = seqnum;
                  *(undefined8 *)((long)&pfVar7->kv_store_name + lVar8) = 0;
                  free_docio_object(&local_10a8,'\x01','\x01','\x01');
                  local_1120 = FDB_RESULT_SUCCESS;
                }
                size = size + 1;
                snap_info = snap_info + 1;
                if (header_len == 0) break;
              }
            }
            *local_10e8 = local_1118;
            *local_10e0 = size;
          }
        }
      }
    }
  }
  return local_1120;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_all_snap_markers(fdb_file_handle *fhandle,
                                    fdb_snapshot_info_t **markers_out,
                                    uint64_t *num_markers)
{
    fdb_kvs_handle *handle;
    bid_t hdr_bid;
    size_t header_len;
    uint8_t header_buf[FDB_BLOCKSIZE];
    bid_t trie_root_bid = BLK_NOT_FOUND;
    bid_t seq_root_bid = BLK_NOT_FOUND;
    bid_t stale_root_bid = BLK_NOT_FOUND;
    uint64_t ndocs;
    uint64_t ndeletes;
    uint64_t nlivenodes;
    uint64_t datasize;
    uint64_t last_wal_flush_hdr_bid;
    uint64_t kv_info_offset;
    uint64_t header_flags;
    uint64_t version;
    char *compacted_filename;
    fdb_seqnum_t seqnum;
    fdb_snapshot_info_t *markers;
    int i;
    uint64_t size, array_size;
    file_status_t fstatus;
    filemgr_header_revnum_t revnum;
    fdb_status status = FDB_RESULT_SUCCESS;

    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!markers_out || !num_markers) {
        return FDB_RESULT_INVALID_ARGS;
    }

    handle = fhandle->root;
    if (!handle->file) {
        return FDB_RESULT_FILE_NOT_OPEN;
    }

    fdb_check_file_reopen(handle, &fstatus);
    fdb_sync_db_header(handle);

    // There are as many DB headers in a file as the file's header revision num
    array_size = handle->cur_header_revnum - sb_get_min_live_revnum(handle->file);
    if (!array_size) {
        return FDB_RESULT_NO_DB_INSTANCE;
    }
    markers = (fdb_snapshot_info_t *)calloc(array_size, sizeof(fdb_snapshot_info_t));
    if (!markers) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    // Start loading from current header
    seqnum = handle->seqnum;
    hdr_bid = handle->last_hdr_bid;
    header_len = handle->file->header.size;
    size = 0;

    uint64_t num_keeping_headers =
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed);

    // Reverse scan the file to locate the DB header with seqnum marker
    for (i = 0; header_len; ++i, ++size) {
        if (handle->config.block_reusing_threshold > 0 &&
            handle->config.block_reusing_threshold < 100 &&
            size >= num_keeping_headers) {
            // if block reuse is enabled,
            // do not allow to scan beyond the config parameter
            break;
        }

        if (i == 0) {
            status = filemgr_fetch_header(handle->file, handle->last_hdr_bid,
                                          header_buf, &header_len, &seqnum,
                                          &revnum, NULL, &version, NULL,
                                          &handle->log_callback);
        } else {
            if ((uint64_t)i >= array_size) {
                break;
            }
            hdr_bid = filemgr_fetch_prev_header(handle->file, hdr_bid,
                                                header_buf, &header_len,
                                                &seqnum, &revnum, NULL, &version,
                                                NULL, &handle->log_callback);
        }
        if (header_len == 0) {
            break; // header doesn't exist, terminate iteration
        }
        if (ver_superblock_support(version) &&
            revnum < sb_get_min_live_revnum(handle->file)) {
            break; // eariler than the last block reclaiming
        }

        fdb_fetch_header(version, header_buf,
                         &trie_root_bid, &seq_root_bid, &stale_root_bid,
                         &ndocs, &ndeletes, &nlivenodes, &datasize,
                         &last_wal_flush_hdr_bid, &kv_info_offset,
                         &header_flags, &compacted_filename, NULL);

        markers[i].marker = (fdb_snapshot_marker_t)hdr_bid;
        if (kv_info_offset == BLK_NOT_FOUND) { // Single kv instance mode
            markers[i].num_kvs_markers = 1;
            markers[i].kvs_markers = (fdb_kvs_commit_marker_t *)malloc(
                                            sizeof(fdb_kvs_commit_marker_t));
            if (!markers[i].kvs_markers) { // LCOV_EXCL_START
                fdb_free_snap_markers(markers, i);
                return FDB_RESULT_ALLOC_FAIL;
            } // LCOV_EXCL_STOP
            markers[i].kvs_markers->seqnum = seqnum;
            markers[i].kvs_markers->kv_store_name = NULL;
        } else { // Multi kv instance mode
            int64_t doc_offset;
            struct docio_object doc;
            memset(&doc, 0, sizeof(struct docio_object));
            doc_offset = docio_read_doc(handle->dhandle, kv_info_offset, &doc,
                                        true);
            if (doc_offset <= 0) {
                fdb_free_snap_markers(markers, i);
                return doc_offset < 0 ? (fdb_status) doc_offset : FDB_RESULT_READ_FAIL;
            }
            status = _fdb_kvs_get_snap_info(doc.body, version,
                                            &markers[i]);
            if (status != FDB_RESULT_SUCCESS) { // LCOV_EXCL_START
                fdb_free_snap_markers(markers, i);
                return status;
            } // LCOV_EXCL_STOP

            int idx = markers[i].num_kvs_markers - 1;
            markers[i].kvs_markers[idx].seqnum = seqnum;
            markers[i].kvs_markers[idx].kv_store_name = NULL;

            free_docio_object(&doc, 1, 1, 1);
        }
    }

    *markers_out = markers;
    *num_markers = size;

    return status;
}